

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

void tcu::getCubeArrayLevelFaces
               (TextureCubeArrayView *texture,int levelNdx,int layerNdx,
               ConstPixelBufferAccess (*out) [6])

{
  CubeFace CVar1;
  ConstPixelBufferAccess *access;
  int iVar2;
  int width;
  int height;
  ConstPixelBufferAccess local_60;
  CubeFace local_34;
  CubeFace local_30;
  CubeFace face;
  int faceNdx;
  int layerDepth;
  ConstPixelBufferAccess *level;
  ConstPixelBufferAccess (*out_local) [6];
  int layerNdx_local;
  int levelNdx_local;
  TextureCubeArrayView *texture_local;
  
  level = *out;
  out_local._0_4_ = layerNdx;
  out_local._4_4_ = levelNdx;
  _layerNdx_local = texture;
  _faceNdx = TextureCubeArrayView::getLevel(texture,levelNdx);
  face = (int)out_local * 6;
  for (local_30 = CUBEFACE_NEGATIVE_X; access = _faceNdx, CVar1 = face, (int)local_30 < 6;
      local_30 = local_30 + CUBEFACE_POSITIVE_X) {
    local_34 = local_30;
    iVar2 = getCubeArrayFaceIndex(local_30);
    width = ConstPixelBufferAccess::getWidth(_faceNdx);
    height = ConstPixelBufferAccess::getHeight(_faceNdx);
    getSubregion(&local_60,access,0,0,CVar1 + iVar2,width,height,1);
    memcpy(level + (int)local_30,&local_60,0x28);
  }
  return;
}

Assistant:

static void getCubeArrayLevelFaces (const TextureCubeArrayView& texture, const int levelNdx, const int layerNdx, ConstPixelBufferAccess (&out)[CUBEFACE_LAST])
{
	const ConstPixelBufferAccess&	level		= texture.getLevel(levelNdx);
	const int						layerDepth	= layerNdx * 6;

	for (int faceNdx = 0; faceNdx < CUBEFACE_LAST; faceNdx++)
	{
		const CubeFace face = (CubeFace)faceNdx;
		out[faceNdx] = getSubregion(level, 0, 0, layerDepth + getCubeArrayFaceIndex(face), level.getWidth(), level.getHeight(), 1);
	}
}